

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MakeCurrentPerfCase::createWindow(MakeCurrentPerfCase *this)

{
  EglTestContext *pEVar1;
  EGLDisplay pvVar2;
  NativeDisplay *pNVar3;
  EGLConfig pvVar4;
  int iVar5;
  NativeWindowFactory *pNVar6;
  undefined4 extraout_var;
  NativeWindow *window;
  EGLSurface surface;
  value_type local_50;
  value_type local_48;
  undefined8 local_3c;
  Visibility local_34;
  
  EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar6 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_50 = (value_type)0x0;
  local_48 = (value_type)0x0;
  pEVar1 = (this->super_TestCase).m_eglTestCtx;
  pvVar2 = this->m_display;
  pNVar3 = (pEVar1->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  pvVar4 = this->m_config;
  local_34 = eglu::parseWindowVisibility(pEVar1->m_testCtx->m_cmdLine);
  local_3c = 0x10000000100;
  iVar5 = (*(pNVar6->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar6,pNVar3,pvVar2,pvVar4);
  local_50 = (value_type)CONCAT44(extraout_var,iVar5);
  local_48 = eglu::createWindowSurface
                       ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                        super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                        .m_data.ptr,local_50,this->m_display,this->m_config,(EGLAttrib *)0x0);
  std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::push_back
            (&this->m_windows,&local_50);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_surfaces,&local_48);
  return;
}

Assistant:

void MakeCurrentPerfCase::createWindow (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const EGLint						width			= 256;
	const EGLint						height			= 256;

	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	eglu::NativeWindow*					window			= DE_NULL;
	EGLSurface							surface			= EGL_NO_SURFACE;

	try
	{
		window	= windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, eglu::WindowParams(width, height, eglu::parseWindowVisibility(m_eglTestCtx.getTestContext().getCommandLine())));
		surface	= eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, m_display, m_config, DE_NULL);
	}
	catch (...)
	{
		if (surface != EGL_NO_SURFACE)
			egl.destroySurface(m_display, surface);

		delete window;
		throw;
	}

	m_windows.push_back(window);
	m_surfaces.push_back(surface);
}